

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockContainer.cpp
# Opt level: O3

bool __thiscall
Rml::BlockContainer::EncloseChildBox
          (BlockContainer *this,LayoutBox *child,Vector2f child_position,float child_height,
          float child_margin_bottom)

{
  Box *this_00;
  Vector2f VVar1;
  bool bVar2;
  Vector2f VVar3;
  float local_28;
  float fStack_24;
  
  this_00 = &this->box;
  VVar1 = Box::GetPosition(this_00,Content);
  local_28 = child_position.x;
  fStack_24 = child_position.y;
  fStack_24 = fStack_24 - ((this->position).y + VVar1.y);
  this->box_cursor = fStack_24 + child_height + child_margin_bottom;
  VVar3.x = (child->visible_overflow_size).x + (local_28 - ((this->position).x + VVar1.x));
  VVar3.y = (child->visible_overflow_size).y + fStack_24;
  VVar1 = Math::Max<Rml::Vector2<float>>(this->inner_content_size,VVar3);
  this->inner_content_size = VVar1;
  VVar3 = Box::GetSize(this_00);
  VVar1.y = this->box_cursor;
  VVar1.x = VVar3.x;
  VVar1 = Math::Max<Rml::Vector2<float>>(VVar1,this->inner_content_size);
  bVar2 = ContainerBox::CatchOverflow(&this->super_ContainerBox,VVar1,this_00,this->max_height);
  return bVar2;
}

Assistant:

bool BlockContainer::EncloseChildBox(LayoutBox* child, Vector2f child_position, float child_height, float child_margin_bottom)
{
	child_position -= (box.GetPosition() + position);

	box_cursor = child_position.y + child_height + child_margin_bottom;

	// Extend the inner content size. The vertical size can be larger than the box_cursor due to overflow.
	inner_content_size = Math::Max(inner_content_size, child_position + child->GetVisibleOverflowSize());

	const Vector2f content_size = Math::Max(Vector2f{box.GetSize().x, box_cursor}, inner_content_size);

	const bool result = CatchOverflow(content_size, box, max_height);

	return result;
}